

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O0

void __thiscall
ANN::ANN(ANN *this,ANNpointArray points,int n1,int n2,int size,int dim,int *topology,
        ANNpoint scaling,int NumNeighbors)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ostream *this_00;
  ANNpoint pAVar4;
  ANNpointArray ppAVar5;
  ulong uVar6;
  void *pvVar7;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000010;
  int in_stack_00000018;
  int j;
  int i;
  int n;
  ANNcoord in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  int local_2c;
  int local_28;
  int local_24;
  
  anncount = anncount + 1;
  if (anncount == 1) {
    this_00 = std::operator<<((ostream *)&std::cout,"MPNN library");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  *in_RDI = in_R8D;
  in_RDI[1] = in_R9D;
  pAVar4 = annAllocPt((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),in_stack_ffffffffffffffa8);
  *(ANNpoint *)(in_RDI + 4) = pAVar4;
  ppAVar5 = annAllocPts((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
                        (int)in_stack_ffffffffffffffb0);
  *(ANNpointArray *)(in_RDI + 2) = ppAVar5;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_stack_00000018;
  uVar6 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)(in_RDI + 6) = pvVar7;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_stack_00000018;
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)(in_RDI + 8) = pvVar7;
  in_RDI[0xe] = 0;
  in_RDI[0xf] = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)*in_RDI;
  uVar6 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  pvVar7 = operator_new__(uVar6);
  *(void **)(in_RDI + 0xc) = pvVar7;
  local_28 = 0;
  for (local_24 = in_EDX; local_24 != in_ECX; local_24 = local_24 + 1) {
    *(int *)(*(long *)(in_RDI + 0xc) + (long)local_28 * 4) = local_24;
    for (local_2c = 0; local_2c < in_RDI[1]; local_2c = local_2c + 1) {
      *(double *)(*(long *)(*(long *)(in_RDI + 2) + (long)local_28 * 8) + (long)local_2c * 8) =
           *(double *)(in_stack_00000010 + (long)local_2c * 8) *
           *(double *)(*(long *)(in_RSI + (long)local_24 * 8) + (long)local_2c * 8);
    }
    local_28 = local_28 + 1;
  }
  pvVar7 = operator_new(0x50);
  ANNkd_tree::ANNkd_tree
            ((ANNkd_tree *)this,points,n1,n2,(double *)CONCAT44(size,dim),_i,(int)topology,
             (ANNsplitRule)scaling);
  *(void **)(in_RDI + 10) = pvVar7;
  return;
}

Assistant:

ANN::ANN(ANNpointArray points, int n1, int n2, int size, int dim, int *topology,
         ANNpoint scaling, int NumNeighbors) {
    int n = 0, i = 0, j = 0;

    anncount++;
    if (anncount == 1) std::cout << "MPNN library" << std::endl;

    numPoints = size;
    dimension = dim;

    query_pt = annAllocPt(dimension);              // allocate query point
    data_pts = annAllocPts(numPoints, dimension);  // allocate data points
    nn_idx = new ANNidx[NumNeighbors];  // allocate near neighbor indices
    dists = new ANNdist[NumNeighbors];  // allocate near neighbor dists
    epsilon = 0.0;

    node_indices = new int[numPoints];  // allocate indices of the points

    // Copy nodes to data_pts
    i = 0;
    for (n = n1; n != n2; n++) {
        node_indices[i] = n;
        for (j = 0; j < dimension; j++) {
            data_pts[i][j] = scaling[j] * points[n][j];
        }
        i++;
    }

    // Initialize ANN
    the_tree = new ANNkd_tree(data_pts,   // the data points
                              numPoints,  // number of points
                              dimension,  // dimension of space
                              scaling,    // scaling of the coordinates
                              topology);  // topology of the space
}